

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

UCPTrie * ucptrie_openFromBinary_63
                    (UCPTrieType type,UCPTrieValueWidth valueWidth,void *data,int32_t length,
                    int32_t *pActualLength,UErrorCode *pErrorCode)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  uint16_t uVar5;
  uint uVar6;
  uint uVar7;
  UCPTrieValueWidth UVar8;
  int iVar9;
  UCPTrie *pUVar10;
  uint32_t uVar11;
  void *pvVar12;
  UCPTrieType UVar13;
  long lVar14;
  uint uVar15;
  int iVar16;
  
  if (U_ZERO_ERROR < *pErrorCode) {
    return (UCPTrie *)0x0;
  }
  if ((((length < 1) || ((uint)(valueWidth + ~UCPTRIE_VALUE_BITS_8) < 0xfffffffc)) ||
      ((uint)(type + ~UCPTRIE_TYPE_SMALL) < 0xfffffffd)) || (((ulong)data & 3) != 0)) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  else {
    if (((0xf < length) && (*data == 0x54726933)) &&
       (uVar1 = *(ushort *)((long)data + 4), (uVar1 & 0x38) == 0)) {
      UVar8 = (uint)uVar1 & 7;
      if (((uint)UVar8 < 3) && (UVar13 = (uint)(uVar1 >> 6) & 3, (uint)UVar13 < 2)) {
        if (type < UCPTRIE_TYPE_FAST) {
          type = UVar13;
        }
        if (valueWidth < UCPTRIE_VALUE_BITS_16) {
          valueWidth = UVar8;
        }
        if (UVar8 == valueWidth && UVar13 == type) {
          uVar2 = *(ushort *)((long)data + 6);
          uVar6 = CONCAT22((short)(((uint)uVar1 << 4) >> 0x10),*(undefined2 *)((long)data + 8));
          iVar9 = (uint)uVar2 * 2 + 0x10;
          if (valueWidth == UCPTRIE_VALUE_BITS_32) {
            iVar9 = iVar9 + uVar6 * 4;
          }
          else if (valueWidth == UCPTRIE_VALUE_BITS_16) {
            iVar9 = (uVar6 + uVar2) * 2 + 0x10;
          }
          else {
            iVar9 = iVar9 + uVar6;
          }
          if (iVar9 <= length) {
            uVar3 = *(ushort *)((long)data + 0xe);
            uVar4 = *(ushort *)((long)data + 0xc);
            uVar5 = *(uint16_t *)((long)data + 10);
            pUVar10 = (UCPTrie *)uprv_malloc_63(0x30);
            if (pUVar10 == (UCPTrie *)0x0) {
              *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
              return (UCPTrie *)0x0;
            }
            iVar16 = (uint)uVar3 * 0x200;
            uVar15 = (uVar1 & 0xf00) * 0x100 + (uint)uVar4;
            pUVar10->index = (uint16_t *)0x0;
            (pUVar10->data).ptr0 = (void *)0x0;
            pUVar10->indexLength = (uint)uVar2;
            pUVar10->dataLength = uVar6;
            pUVar10->highStart = iVar16;
            pUVar10->shifted12HighStart = (uint16_t)(iVar16 + 0xfffU >> 0xc);
            pUVar10->type = (int8_t)type;
            pUVar10->valueWidth = (int8_t)valueWidth;
            pUVar10->reserved32 = 0;
            pUVar10->reserved16 = 0;
            pUVar10->index3NullOffset = uVar5;
            pUVar10->dataNullOffset = uVar15;
            pUVar10->nullValue = 0;
            pUVar10->index = (uint16_t *)((long)data + 0x10);
            uVar7 = uVar6 - 2;
            if (uVar15 < uVar6) {
              uVar7 = uVar15;
            }
            pvVar12 = (void *)((long)data + (ulong)uVar2 * 2 + 0x10);
            (pUVar10->data).ptr0 = pvVar12;
            lVar14 = (long)(int)uVar7;
            if (valueWidth == UCPTRIE_VALUE_BITS_8) {
              uVar11 = (uint32_t)*(byte *)((long)pvVar12 + lVar14);
            }
            else if (valueWidth == UCPTRIE_VALUE_BITS_32) {
              uVar11 = *(uint32_t *)((long)pvVar12 + lVar14 * 4);
            }
            else {
              uVar11 = (uint32_t)*(ushort *)((long)pvVar12 + lVar14 * 2);
            }
            pUVar10->nullValue = uVar11;
            if (pActualLength != (int32_t *)0x0) {
              *pActualLength = iVar9;
              return pUVar10;
            }
            return pUVar10;
          }
        }
      }
    }
    *pErrorCode = U_INVALID_FORMAT_ERROR;
  }
  return (UCPTrie *)0x0;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }